

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::Program::disableAttributeArray
          (Program *this,VarSpec *attrSpec,string *shaderNameManglingSuffix)

{
  GLuint GVar1;
  string local_30;
  
  GVar1 = this->m_programGL;
  mangleShaderNames(&local_30,&attrSpec->name,shaderNameManglingSuffix);
  GVar1 = glwGetAttribLocation(GVar1,local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  glwDisableVertexAttribArray(GVar1);
  return;
}

Assistant:

void Program::disableAttributeArray (const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glDisableVertexAttribArray(attrLoc);
}